

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<10,_2,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Vec4 *pVVar1;
  float afVar2 [2];
  float afVar3 [2];
  int i;
  undefined8 *puVar4;
  long lVar5;
  int col;
  long lVar6;
  float *pfVar7;
  int col_1;
  bool bVar8;
  undefined4 uVar9;
  float fVar10;
  Mat2 m;
  Vector<float,_3> res;
  Mat2 m_1;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [4];
  float local_68 [6];
  int local_50 [6];
  Matrix<float,_2,_2> local_38;
  float local_20;
  float local_1c;
  undefined4 local_18;
  float local_14;
  
  puVar4 = &local_88;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar5 != lVar6) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)puVar4 + lVar6 * 8) = uVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    puVar4 = (undefined8 *)((long)puVar4 + 4);
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  pVVar1 = evalCtx->in;
  local_68[3] = pVVar1->m_data[0];
  afVar2 = *(float (*) [2])pVVar1->m_data;
  local_88 = *(undefined8 *)pVVar1->m_data;
  pVVar1 = evalCtx->in + 1;
  local_68[4] = pVVar1->m_data[0];
  afVar3 = *(float (*) [2])pVVar1->m_data;
  uStack_80 = *(undefined8 *)pVVar1->m_data;
  local_68[5] = evalCtx->in[1].m_data[1] + evalCtx->in[0].m_data[1];
  pfVar7 = (float *)&local_38;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      fVar10 = 1.0;
      if (lVar5 != lVar6) {
        fVar10 = 0.0;
      }
      pfVar7[lVar6 * 2] = fVar10;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar7 = pfVar7 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  local_38.m_data.m_data[0].m_data = afVar2;
  local_38.m_data.m_data[1].m_data = afVar3;
  decrement<float,2,2>((MatrixCaseUtils *)&local_20,&local_38);
  local_68[0] = local_20;
  local_68[1] = (float)local_18;
  local_68[2] = local_1c + local_14;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  lVar5 = 0;
  do {
    local_78[lVar5] = local_68[lVar5 + 3] + local_68[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_50[2] = 0;
  local_50[3] = 1;
  local_50[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[local_50[lVar5]] = *(float *)((long)&uStack_80 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}